

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

iterator __thiscall
re2::SparseArray<re2::NFA::Thread_*>::set_existing
          (SparseArray<re2::NFA::Thread_*> *this,int i,Thread *v)

{
  uint uVar1;
  uint uVar2;
  pointer pIVar3;
  
  uVar1 = this->size_;
  if ((int)uVar1 < 0) {
    __assert_fail("(0) <= (size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c4,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
  if (this->max_size_ < (int)uVar1) {
    __assert_fail("(size_) <= (max_size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c5,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
  if (this->sparse_to_dense_ != (int *)0x0 || uVar1 == 0) {
    if (i < 0) {
      __assert_fail("(i) >= (0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x134,
                    "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                   );
    }
    if ((uint)this->max_size_ <= (uint)i) {
      __assert_fail("(i) < (max_size_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                    ,0x135,
                    "bool re2::SparseArray<re2::NFA::Thread *>::has_index(int) const [Value = re2::NFA::Thread *]"
                   );
    }
    uVar2 = this->sparse_to_dense_[(uint)i];
    if (uVar2 < uVar1) {
      pIVar3 = (this->dense_).
               super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pIVar3[uVar2].index_ == i) {
        pIVar3[uVar2].second = v;
        if (this->sparse_to_dense_ != (int *)0x0) {
          return (iterator)
                 ((this->dense_).
                  super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
                  ._M_impl.super__Vector_impl_data._M_start + this->sparse_to_dense_[(uint)i]);
        }
        goto LAB_00135f2f;
      }
    }
    __assert_fail("has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x176,
                  "typename SparseArray<Value>::iterator re2::SparseArray<re2::NFA::Thread *>::set_existing(int, Value) [Value = re2::NFA::Thread *]"
                 );
  }
LAB_00135f2f:
  __assert_fail("size_ == 0 || sparse_to_dense_ != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x1c6,
                "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
               );
}

Assistant:

typename SparseArray<Value>::iterator
SparseArray<Value>::set_existing(int i, Value v) {
  DebugCheckInvariants();
  DCHECK(has_index(i));
  dense_[sparse_to_dense_[i]].second = v;
  DebugCheckInvariants();
  return dense_.begin() + sparse_to_dense_[i];
}